

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  int nVars;
  uint uVar1;
  uint uVar2;
  Extra_SymmInfo_t *pEVar3;
  void *__s;
  DdNode *n;
  DdNode *n_00;
  int iVar2;
  int iVar1;
  DdNode *zTemp;
  DdNode *zCube;
  DdNode *zSet;
  DdNode *bTemp;
  int *pMapVars2Nums;
  Extra_SymmInfo_t *p;
  int nSuppSize;
  int i;
  DdNode *bSupp_local;
  DdNode *zPairs_local;
  DdManager *dd_local;
  
  nVars = Extra_bddSuppSize(dd,bSupp);
  pEVar3 = Extra_SymmPairsAllocate(nVars);
  __s = malloc((long)dd->size << 2);
  memset(__s,0,(long)dd->size << 2);
  pEVar3->nVarsMax = dd->size;
  pEVar3->nNodes = 0;
  p._4_4_ = 0;
  for (zSet = bSupp; zSet != dd->one; zSet = (zSet->type).kids.T) {
    pEVar3->pVars[p._4_4_] = zSet->index;
    *(int *)((long)__s + (ulong)zSet->index * 4) = p._4_4_;
    p._4_4_ = p._4_4_ + 1;
  }
  Cudd_Ref(zPairs);
  zCube = zPairs;
  while( true ) {
    if (zCube == dd->zero) {
      Cudd_RecursiveDerefZdd(dd,zCube);
      if (__s != (void *)0x0) {
        free(__s);
      }
      return pEVar3;
    }
    n = Extra_zddSelectOneSubset(dd,zCube);
    Cudd_Ref(n);
    if ((((n->type).kids.T)->type).kids.T != dd->one) break;
    uVar1 = n->index >> 1;
    uVar2 = ((n->type).kids.T)->index >> 1;
    if (*(int *)((long)__s + (long)(int)uVar1 * 4) < *(int *)((long)__s + (long)(int)uVar2 * 4)) {
      pEVar3->pSymms[*(int *)((long)__s + (long)(int)uVar1 * 4)]
      [*(int *)((long)__s + (long)(int)uVar2 * 4)] = '\x01';
    }
    else {
      pEVar3->pSymms[*(int *)((long)__s + (long)(int)uVar2 * 4)]
      [*(int *)((long)__s + (long)(int)uVar1 * 4)] = '\x01';
    }
    pEVar3->nSymms = pEVar3->nSymms + 1;
    n_00 = Cudd_zddDiff(dd,zCube,n);
    Cudd_Ref(n_00);
    Cudd_RecursiveDerefZdd(dd,zCube);
    Cudd_RecursiveDerefZdd(dd,n);
    zCube = n_00;
  }
  __assert_fail("cuddT( cuddT(zCube) ) == z1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                ,0x145,
                "Extra_SymmInfo_t *Extra_SymmPairsCreateFromZdd(DdManager *, DdNode *, DdNode *)");
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    int i;
    int nSuppSize;
    Extra_SymmInfo_t * p;
    int * pMapVars2Nums;
    DdNode * bTemp;
    DdNode * zSet, * zCube, * zTemp;
    int iVar1, iVar2;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_SymmPairsAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
//  p->nNodes   = Cudd_DagSize( zPairs );
    p->nNodes   = 0;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i] = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add these two variables to the data structure
        assert( cuddT( cuddT(zCube) ) == z1 );
        iVar1 = zCube->index/2;
        iVar2 = cuddT(zCube)->index/2;
        if ( pMapVars2Nums[iVar1] < pMapVars2Nums[iVar2] )
            p->pSymms[ pMapVars2Nums[iVar1] ][ pMapVars2Nums[iVar2] ] = 1;
        else
            p->pSymms[ pMapVars2Nums[iVar2] ][ pMapVars2Nums[iVar1] ] = 1;
        // count the symmetric pairs
        p->nSymms ++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );

    ABC_FREE( pMapVars2Nums );
    return p;

}